

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorRegressor::clear_supportVectors(SupportVectorRegressor *this)

{
  SupportVectorsCase SVar1;
  SupportVectorRegressor *this_local;
  
  SVar1 = supportVectors_case(this);
  if (SVar1 != SUPPORTVECTORS_NOT_SET) {
    if (SVar1 == kSparseSupportVectors) {
      if ((this->supportVectors_).sparsesupportvectors_ != (SparseSupportVectors *)0x0) {
        (*(((this->supportVectors_).sparsesupportvectors_)->super_MessageLite)._vptr_MessageLite[1])
                  ();
      }
    }
    else if ((SVar1 == kDenseSupportVectors) &&
            ((this->supportVectors_).sparsesupportvectors_ != (SparseSupportVectors *)0x0)) {
      (*(((this->supportVectors_).sparsesupportvectors_)->super_MessageLite)._vptr_MessageLite[1])()
      ;
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void SupportVectorRegressor::clear_supportVectors() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.SupportVectorRegressor)
  switch (supportVectors_case()) {
    case kSparseSupportVectors: {
      delete supportVectors_.sparsesupportvectors_;
      break;
    }
    case kDenseSupportVectors: {
      delete supportVectors_.densesupportvectors_;
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = SUPPORTVECTORS_NOT_SET;
}